

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O1

void fill_string_pool(xmlChar **strings,char **seeds)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlHashTablePtr hash;
  StringPool *pool;
  StringPool *pool_00;
  uint uVar7;
  int extraout_EDX;
  uint uVar8;
  size_t sVar9;
  xmlChar *pxVar10;
  undefined8 in_R9;
  long lVar11;
  long unaff_R13;
  ulong uVar12;
  xmlChar **ppxVar13;
  ulong uVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uStack_78;
  
  if (*seeds == (char *)0x0) {
    ppxVar13 = (xmlChar **)0x0;
  }
  else {
    ppxVar13 = (xmlChar **)0x0;
    do {
      pxVar5 = (xmlChar *)xmlStrdup();
      strings[(long)ppxVar13] = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        fill_string_pool_cold_1();
        goto LAB_0010322b;
      }
      lVar11 = (long)ppxVar13 + 1;
      ppxVar13 = (xmlChar **)((long)ppxVar13 + 1);
    } while (seeds[lVar11] != (char *)0x0);
  }
  if ((uint)ppxVar13 < 90000) {
    uVar12 = (ulong)ppxVar13 & 0xffffffff;
    uVar3 = 0;
    iVar4 = 0;
    do {
      unaff_R13 = (long)iVar4;
      ppxVar13 = (xmlChar **)(ulong)uVar3;
      pxVar5 = (xmlChar *)xmlStrncatNew(strings[unaff_R13],strings[(long)ppxVar13],0xffffffff);
      strings[uVar12] = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) goto LAB_00103230;
      iVar2 = xmlStrlen(pxVar5);
      if (0x1e < iVar2) goto LAB_00103235;
      bVar15 = 0x30 < iVar4;
      bVar1 = 0x30 < iVar4;
      iVar4 = iVar4 + 1;
      if (bVar1) {
        iVar4 = 0;
      }
      uVar3 = bVar15 + uVar3;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 90000);
    ppxVar13 = (xmlChar **)0x15f90;
  }
  uVar3 = (uint)ppxVar13;
  if (uVar3 < 100000) {
    ppxVar13 = strings + ((ulong)ppxVar13 & 0xffffffff);
    uVar12 = 499;
    if ((ulong)(99999 - uVar3) < 499) {
      uVar12 = (ulong)(99999 - uVar3);
    }
    unaff_R13 = uVar12 + 1;
    lVar11 = 0;
    iVar4 = 0;
    do {
      pxVar5 = (xmlChar *)xmlStrncatNew(strings[iVar4],":",0xffffffff);
      ppxVar13[lVar11] = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
LAB_0010322b:
        fill_string_pool_cold_3();
LAB_00103230:
        fill_string_pool_cold_4();
LAB_00103235:
        fprintf(_stderr,"### %s %s\n",strings[unaff_R13 + 90000],strings[(long)ppxVar13]);
        abort();
      }
      iVar2 = iVar4 + 1;
      if (0x15f8e < iVar4) {
        iVar2 = 0;
      }
      lVar11 = lVar11 + 1;
      iVar4 = iVar2;
    } while ((int)unaff_R13 != (int)lVar11);
    uVar3 = uVar3 + (int)lVar11;
  }
  if (uVar3 < 100000) {
    uVar12 = (ulong)uVar3;
    iVar4 = 0;
    iVar2 = 0;
    do {
      pxVar5 = strings[(long)iVar2 + 90000];
      pxVar10 = strings[iVar4];
      pxVar6 = (xmlChar *)xmlStrncatNew(pxVar5,pxVar10,0xffffffff);
      strings[uVar12] = pxVar6;
      if (pxVar6 == (xmlChar *)0x0) {
        fill_string_pool_cold_2();
        if (extraout_EDX == 0) {
          uStack_78 = 0;
          hash = (xmlHashTablePtr)xmlHashCreate(0);
        }
        else {
          uStack_78 = xmlDictCreate();
          hash = (xmlHashTablePtr)xmlHashCreateDict(0);
        }
        pool = (StringPool *)(*_xmlMalloc)(0x30);
        pool->num_entries = (size_t)pxVar5;
        pool->num_keys = (size_t)pxVar10;
        sVar9 = (long)pxVar10 * (long)pxVar5;
        __n = sVar9 * 8;
        ppxVar13 = (xmlChar **)(*_xmlMalloc)(__n);
        pool->strings = ppxVar13;
        memset(ppxVar13,0,__n);
        pool->num_strings = sVar9;
        pool->index = 0;
        pool->id = '1';
        pool_00 = (StringPool *)(*_xmlMalloc)(0x30);
        pool_00->num_entries = (size_t)pxVar5;
        pool_00->num_keys = (size_t)pxVar10;
        ppxVar13 = (xmlChar **)(*_xmlMalloc)(__n);
        pool_00->strings = ppxVar13;
        memset(ppxVar13,0,__n);
        pool_00->num_strings = sVar9;
        uVar16 = 0;
        pool_00->index = 0;
        pool_00->id = '2';
        if (sVar9 != 0) {
          uVar16 = 0;
          do {
            uVar3 = rng_state_0 * -0x61c88645;
            uVar8 = rng_state_0 * -0x3910c8a0;
            uVar7 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar7 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar7;
            rng_state_1 = uVar7 << 0xd | uVar7 >> 0x13;
            iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar3 >> 0x1b | uVar8) * 5) % 0x32));
            if (iVar4 != 0) {
              test_hash_cold_1();
              uVar16 = 1;
            }
            uVar3 = rng_state_0 * -0x61c88645;
            uVar8 = rng_state_0 * -0x3910c8a0;
            uVar7 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar7 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar7;
            rng_state_1 = uVar7 << 0xd | uVar7 >> 0x13;
            iVar4 = pool_bulk_insert(pool_00,hash,(ulong)(((uVar3 >> 0x1b | uVar8) * 5) % 100));
            if (iVar4 != 0) {
              test_hash_cold_2();
              uVar16 = 1;
            }
          } while (pool_00->index < pool_00->num_strings);
        }
        pool_00->index = 0;
        iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,1);
        if (iVar4 != 0) {
          test_hash_cold_3();
          uVar16 = 1;
        }
        pool_00->index = 0;
        while ((pool->index < pool->num_strings || (pool_00->index < pool_00->num_strings))) {
          uVar3 = rng_state_0 * -0x61c88645;
          uVar8 = rng_state_0 * -0x3910c8a0;
          uVar7 = rng_state_1 ^ rng_state_0;
          rng_state_0 = uVar7 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar7;
          rng_state_1 = uVar7 << 0xd | uVar7 >> 0x13;
          iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar3 >> 0x1b | uVar8) * 5) % 0x32));
          if (iVar4 != 0) {
            test_hash_cold_6();
            uVar16 = 1;
          }
          uVar3 = rng_state_1 ^ rng_state_0;
          uVar7 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
          rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
          uVar12 = pool_00->index;
          if ((uVar12 < pool_00->num_strings) &&
             (uVar3 = ((rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 * -0x3910c8a0) * 5) % 100,
             uVar3 != 0)) {
            uVar8 = 0;
            uVar14 = 1;
            rng_state_0 = uVar7;
            do {
              ppxVar13 = pool_00->strings;
              sVar9 = pool_00->num_keys;
              if (sVar9 == 3) {
                iVar4 = xmlHashRemoveEntry3(hash,ppxVar13[uVar12],ppxVar13[uVar12 + 1],
                                            ppxVar13[uVar12 + 2],0,in_R9,uVar16);
              }
              else if (sVar9 == 2) {
                iVar4 = xmlHashRemoveEntry2(hash,ppxVar13[uVar12],ppxVar13[uVar12 + 1],0);
              }
              else {
                iVar4 = -1;
                if (sVar9 == 1) {
                  iVar4 = xmlHashRemoveEntry(hash,ppxVar13[uVar12],0);
                }
              }
              uVar8 = uVar8 | -(uint)(iVar4 != 0);
              uVar12 = uVar12 + pool_00->num_keys;
            } while ((uVar12 < pool_00->num_strings) &&
                    (bVar15 = uVar14 < uVar3, uVar14 = uVar14 + 1, bVar15));
            pool_00->index = uVar12;
            if (uVar8 != 0) {
              test_hash_cold_7();
              uVar16 = 1;
            }
          }
          else {
            rng_state_0 = uVar7;
            pool_00->index = uVar12;
          }
        }
        pool->index = 0;
        iVar4 = pool_bulk_lookup(pool,hash,pool->num_entries,1);
        if (iVar4 != 0) {
          test_hash_cold_4();
        }
        pool_00->index = 0;
        iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,0);
        if (iVar4 != 0) {
          test_hash_cold_5();
        }
        pool_free(pool);
        pool_free(pool_00);
        xmlHashFree(hash,0);
        xmlDictFree(uStack_78);
        return;
      }
      bVar15 = 0x1f2 < iVar2;
      iVar2 = iVar2 + 1;
      if (bVar15) {
        iVar2 = 0;
      }
      bVar15 = 0x15f8a < iVar4;
      iVar4 = iVar4 + 5;
      if (bVar15) {
        iVar4 = 0;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 100000);
  }
  return;
}

Assistant:

static void
fill_string_pool(xmlChar **strings, const char **seeds) {
    int i, j, k;
    int start_ns = NB_STRINGS_MAX - NB_STRINGS_NS;

    /*
     * That's a bit nasty but the output is fine and it doesn't take hours
     * there is a small but sufficient number of duplicates, and we have
     * ":xxx" and full QNames in the last NB_STRINGS_NS values
     */
    for (i = 0; seeds[i] != NULL; i++) {
        strings[i] = xmlStrdup((const xmlChar *) seeds[i]);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
    }
    for (j = 0, k = 0; i < start_ns; i++) {
        strings[i] = xmlStrncatNew(strings[j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        if (xmlStrlen(strings[i]) > 30) {
            fprintf(stderr, "### %s %s\n", strings[start_ns+j], strings[k]);
            abort();
        }
        j++;
	if (j >= 50) {
	    j = 0;
	    k++;
	}
    }
    for (j = 0, k = 0; (j < NB_STRINGS_PREFIX) && (i < NB_STRINGS_MAX);
         i++, j++) {
        strings[i] = xmlStrncatNew(strings[k], (const xmlChar *) ":", -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        k += 1;
        if (k >= start_ns) k = 0;
    }
    for (j = 0, k = 0; i < NB_STRINGS_MAX; i++) {
        strings[i] = xmlStrncatNew(strings[start_ns+j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        j++;
        if (j >= NB_STRINGS_PREFIX) j = 0;
	k += 5;
        if (k >= start_ns) k = 0;
    }
}